

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelper_TextFormatDecodeData_RawStrings_Test::TestBody
          (ObjCHelper_TextFormatDecodeData_RawStrings_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_190;
  Message local_188;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_148 [8];
  string expected;
  uint8_t expected_data [53];
  AssertHelper local_e8;
  Message local_e0;
  size_t local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68 [2];
  string_view local_48;
  string_view local_38;
  undefined1 local_28 [8];
  TextFormatDecodeData decode_data;
  ObjCHelper_TextFormatDecodeData_RawStrings_Test *this_local;
  
  decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"zbcdefghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,1,local_38,local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"abcdezghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,3,local_68[0],local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"abcdefghI");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,2,local_88,local_98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"abcdefghIJz");
  TextFormatDecodeData::AddString
            ((TextFormatDecodeData *)local_28,4,local_a8,stack0xffffffffffffff48);
  local_cc = 4;
  local_d8 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_28);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c8,"4","decode_data.num_entries()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  expected.field_2._8_8_ = 0x656463627a000104;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_148,expected.field_2._M_local_buf + 8,0x35,
             (allocator *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  TextFormatDecodeData::Data_abi_cxx11_(&local_180,(TextFormatDecodeData *)local_28);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_160,"expected","decode_data.Data()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
             &local_180);
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::__cxx11::string::~string((string *)local_148);
  TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_28);
  return;
}

Assistant:

TEST(ObjCHelper, TextFormatDecodeData_RawStrings) {
  TextFormatDecodeData decode_data;

  // Different data, can't transform.
  decode_data.AddString(1, "abcdefghIJ", "zbcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "abcdezghIJ");
  // Shortened data, can't transform.
  decode_data.AddString(2, "abcdefghIJ", "abcdefghI");
  // Extra data, can't transform.
  decode_data.AddString(4, "abcdefghIJ", "abcdefghIJz");

  EXPECT_EQ(4, decode_data.num_entries());

  uint8_t expected_data[] = {
      // clang-format off
      0x4,
      0x1, 0x0, 'z', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 'J', 0x0,
      0x3, 0x0, 'a', 'b', 'c', 'd', 'e', 'z', 'g', 'h', 'I', 'J', 0x0,
      0x2, 0x0, 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 0x0,
      0x4, 0x0, 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 'J', 'z', 0x0,
      // clang-format on
  };
  std::string expected((const char*)expected_data, sizeof(expected_data));

  EXPECT_EQ(expected, decode_data.Data());
}